

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionObject.cpp
# Opt level: O3

char * __thiscall
cbtCollisionObject::serialize(cbtCollisionObject *this,void *dataBuffer,cbtSerializer *serializer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  cbtBroadphaseProxy *pcVar3;
  int iVar4;
  cbtTransform *pcVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  pcVar5 = &this->m_worldTransform;
  lVar7 = (long)dataBuffer + 0x20;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      *(cbtScalar *)(lVar7 + lVar9 * 4) = (pcVar5->m_basis).m_el[0].m_floats[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x10;
    pcVar5 = (cbtTransform *)((pcVar5->m_basis).m_el + 1);
  } while (lVar8 != 3);
  lVar7 = 0xe;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar7 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar7 + -2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x12);
  pcVar5 = &this->m_interpolationWorldTransform;
  lVar7 = (long)dataBuffer + 0x60;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      *(cbtScalar *)(lVar7 + lVar9 * 4) = (pcVar5->m_basis).m_el[0].m_floats[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x10;
    pcVar5 = (cbtTransform *)((pcVar5->m_basis).m_el + 1);
  } while (lVar8 != 3);
  lVar7 = 0x1e;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar7 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar7 + -2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x22);
  lVar7 = 0x22;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar7 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar7 + -2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x26);
  lVar7 = 0x26;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar7 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar7 + -2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x2a);
  lVar7 = 0x2a;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar7 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar7 + -2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x2e);
  *(int *)((long)dataBuffer + 0xf8) = this->m_hasAnisotropicFriction;
  *(cbtScalar *)((long)dataBuffer + 0xd0) = this->m_contactProcessingThreshold;
  *(undefined8 *)dataBuffer = 0;
  uVar6 = (**(code **)(*(long *)serializer + 0x38))(serializer,this->m_collisionShape);
  *(undefined8 *)((long)dataBuffer + 8) = uVar6;
  *(undefined8 *)((long)dataBuffer + 0x10) = 0;
  *(undefined8 *)((long)dataBuffer + 0xfc) = *(undefined8 *)&this->m_collisionFlags;
  *(int *)((long)dataBuffer + 0x104) = this->m_companionId;
  *(int *)((long)dataBuffer + 0x108) = this->m_activationState1;
  *(undefined8 *)((long)dataBuffer + 0xd4) = *(undefined8 *)&this->m_deactivationTime;
  *(cbtScalar *)((long)dataBuffer + 0xdc) = this->m_rollingFriction;
  *(undefined8 *)((long)dataBuffer + 0xe0) = *(undefined8 *)&this->m_contactDamping;
  *(cbtScalar *)((long)dataBuffer + 0xe8) = this->m_restitution;
  *(int *)((long)dataBuffer + 0x10c) = this->m_internalType;
  uVar6 = (**(code **)(*(long *)serializer + 0x50))(serializer,this);
  lVar7 = (**(code **)(*(long *)serializer + 0x38))(serializer,uVar6);
  *(long *)((long)dataBuffer + 0x18) = lVar7;
  if (lVar7 != 0) {
    (**(code **)(*(long *)serializer + 0x60))(serializer,uVar6);
  }
  *(undefined8 *)((long)dataBuffer + 0xec) = *(undefined8 *)&this->m_hitFraction;
  *(cbtScalar *)((long)dataBuffer + 0xf4) = this->m_ccdMotionThreshold;
  *(int *)((long)dataBuffer + 0x110) = this->m_checkCollideWith;
  pcVar3 = this->m_broadphaseHandle;
  if (pcVar3 == (cbtBroadphaseProxy *)0x0) {
    auVar10._0_12_ = ZEXT812(0);
    auVar10._12_4_ = 0;
    iVar4 = -1;
  }
  else {
    uVar1 = pcVar3->m_collisionFilterGroup;
    uVar2 = pcVar3->m_collisionFilterMask;
    auVar10._4_4_ = uVar2;
    auVar10._0_4_ = uVar1;
    auVar10._8_8_ = 0;
    iVar4 = pcVar3->m_uniqueId;
  }
  uVar6 = vmovlps_avx(auVar10);
  *(undefined8 *)((long)dataBuffer + 0x114) = uVar6;
  *(int *)((long)dataBuffer + 0x11c) = iVar4;
  return "cbtCollisionObjectFloatData";
}

Assistant:

const char* cbtCollisionObject::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtCollisionObjectData* dataOut = (cbtCollisionObjectData*)dataBuffer;

	m_worldTransform.serialize(dataOut->m_worldTransform);
	m_interpolationWorldTransform.serialize(dataOut->m_interpolationWorldTransform);
	m_interpolationLinearVelocity.serialize(dataOut->m_interpolationLinearVelocity);
	m_interpolationAngularVelocity.serialize(dataOut->m_interpolationAngularVelocity);
	m_anisotropicFriction.serialize(dataOut->m_anisotropicFriction);
	dataOut->m_hasAnisotropicFriction = m_hasAnisotropicFriction;
	dataOut->m_contactProcessingThreshold = m_contactProcessingThreshold;
	dataOut->m_broadphaseHandle = 0;
	dataOut->m_collisionShape = serializer->getUniquePointer(m_collisionShape);
	dataOut->m_rootCollisionShape = 0;  //@todo
	dataOut->m_collisionFlags = m_collisionFlags;
	dataOut->m_islandTag1 = m_islandTag1;
	dataOut->m_companionId = m_companionId;
	dataOut->m_activationState1 = m_activationState1;
	dataOut->m_deactivationTime = m_deactivationTime;
	dataOut->m_friction = m_friction;
	dataOut->m_rollingFriction = m_rollingFriction;
	dataOut->m_contactDamping = m_contactDamping;
	dataOut->m_contactStiffness = m_contactStiffness;
	dataOut->m_restitution = m_restitution;
	dataOut->m_internalType = m_internalType;

	char* name = (char*)serializer->findNameForPointer(this);
	dataOut->m_name = (char*)serializer->getUniquePointer(name);
	if (dataOut->m_name)
	{
		serializer->serializeName(name);
	}
	dataOut->m_hitFraction = m_hitFraction;
	dataOut->m_ccdSweptSphereRadius = m_ccdSweptSphereRadius;
	dataOut->m_ccdMotionThreshold = m_ccdMotionThreshold;
	dataOut->m_checkCollideWith = m_checkCollideWith;
	if (m_broadphaseHandle)
	{
		dataOut->m_collisionFilterGroup = m_broadphaseHandle->m_collisionFilterGroup;
		dataOut->m_collisionFilterMask = m_broadphaseHandle->m_collisionFilterMask;
		dataOut->m_uniqueId = m_broadphaseHandle->m_uniqueId;
	}
	else
	{
		dataOut->m_collisionFilterGroup = 0;
		dataOut->m_collisionFilterMask = 0;
		dataOut->m_uniqueId = -1;
	}
	return cbtCollisionObjectDataName;
}